

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t CheckCompression(matroska_block *Block,int ForProfile)

{
  int *piVar1;
  ebml_master *peVar2;
  char *pcVar3;
  filepos_t fVar4;
  ebml_context *peVar5;
  ebml_master *peVar6;
  ebml_integer *Element;
  ulong uVar7;
  int64_t iVar8;
  ebml_element *peVar9;
  ulong uVar10;
  err_t eVar11;
  
  peVar6 = Block->ReadTrack;
  if (peVar6 == (ebml_master *)0x0) {
    __assert_fail("Block->ReadTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0xe7,"err_t CheckCompression(matroska_block *, int)");
  }
  peVar5 = MATROSKA_getContextContentEncodings();
  eVar11 = 0;
  peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
  if ((peVar6 != (ebml_master *)0x0) && (eVar11 = -4, (Block->Data)._Used == 0)) {
    peVar5 = MATROSKA_getContextContentEncoding();
    eVar11 = 0;
    peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
    if ((peVar6->Base).Base.Children != (nodetree *)0x0) {
      peVar2 = (ebml_master *)(peVar6->Base).Base.Next;
      if (peVar6 == peVar2) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0xf1,"err_t CheckCompression(matroska_block *, int)");
      }
      eVar11 = -3;
      if (peVar2 == (ebml_master *)0x0) {
        peVar5 = MATROSKA_getContextContentCompression();
        peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
        if (peVar6 != (ebml_master *)0x0) {
          peVar5 = MATROSKA_getContextContentCompAlgo();
          Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar6,peVar5,1,1,ForProfile);
          if ((Element != (ebml_integer *)0x0) &&
             (uVar7 = EBML_IntegerValue(Element), (uVar7 & 0xfffffffc) == 0)) {
            iVar8 = EBML_IntegerValue(Element);
            if (iVar8 == 3) {
              peVar5 = MATROSKA_getContextContentCompSettings();
              peVar9 = EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
              if (peVar9 == (ebml_element *)0x0) {
                return 0;
              }
              uVar7 = (Block->SizeList)._Used;
              if (3 < uVar7) {
                pcVar3 = (Block->SizeList)._Begin;
                fVar4 = peVar9->DataSize;
                uVar10 = 0;
                do {
                  piVar1 = (int *)(pcVar3 + uVar10);
                  *piVar1 = *piVar1 + (int)fVar4;
                  uVar10 = uVar10 + 4;
                } while ((uVar7 & 0xfffffffffffffffc) != uVar10);
                return 0;
              }
            }
            eVar11 = 0;
          }
        }
      }
    }
  }
  return eVar11;
}

Assistant:

static err_t CheckCompression(matroska_block *Block, int ForProfile)
{
    ebml_master *Elt, *Header;
    assert(Block->ReadTrack!=NULL);
    Elt = (ebml_master*)EBML_MasterFindChild(Block->ReadTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        if (ARRAYCOUNT(Block->Data,uint8_t))
            return ERR_INVALID_PARAM; // we cannot adjust sizes if the data are already read

        Elt = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = (ebml_master*)EBML_MasterGetChild(Elt, MATROSKA_getContextContentCompAlgo(), ForProfile);
            MatroskaTrackEncodingCompAlgo CompressionAlgo = Header ? EBML_IntegerValue((ebml_integer*)Header) : MATROSKA_TRACK_ENCODING_COMP_NONE;
            bool_t CanDecompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanDecompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanDecompress = 1;
#endif
#if defined(CONFIG_LZO1X)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_LZO1X)
                CanDecompress = 1;
#endif
#if defined(CONFIG_BZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_BZLIB)
                CanDecompress = 1;
#endif
            if (!CanDecompress)
                return ERR_INVALID_DATA;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
            {
                Header = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentCompSettings());
                if (Header)
                {
                    uint32_t *i;
                    for (i=ARRAYBEGIN(Block->SizeList,uint32_t);i!=ARRAYEND(Block->SizeList,uint32_t);++i)
                        *i += (uint32_t)Header->Base.DataSize;
                }
            }
        }
    }
    return ERR_NONE;
}